

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

DenselySampledSpectrum *
pbrt::DenselySampledSpectrum::SampleFunction<RGBSpectrum_RoundTripsRGB_Test::TestBody()::__0>
          (anon_class_16_2_f9f080e8 func,int lambda_min,int lambda_max,Allocator alloc)

{
  int in_ECX;
  DenselySampledSpectrum *in_RDI;
  int in_R8D;
  Float FVar1;
  int lambda;
  DenselySampledSpectrum *s;
  Float in_stack_ffffffffffffff8c;
  anon_class_16_2_f9f080e8 *in_stack_ffffffffffffff90;
  DenselySampledSpectrum *pDVar2;
  Allocator in_stack_ffffffffffffffb0;
  int local_3c;
  
  pDVar2 = in_RDI;
  DenselySampledSpectrum(in_RDI,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffb0);
  for (local_3c = in_ECX; local_3c <= in_R8D; local_3c = local_3c + 1) {
    FVar1 = RGBSpectrum_RoundTripsRGB_Test::TestBody::anon_class_16_2_f9f080e8::operator()
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    in_stack_ffffffffffffff90 =
         (anon_class_16_2_f9f080e8 *)
         pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                   (&in_RDI->values,(long)(local_3c - in_ECX));
    *(Float *)&in_stack_ffffffffffffff90->rs = FVar1;
  }
  return pDVar2;
}

Assistant:

static DenselySampledSpectrum SampleFunction(F func, int lambda_min = Lambda_min,
                                                 int lambda_max = Lambda_max,
                                                 Allocator alloc = {}) {
        DenselySampledSpectrum s(lambda_min, lambda_max, alloc);
        for (int lambda = lambda_min; lambda <= lambda_max; ++lambda)
            s.values[lambda - lambda_min] = func(lambda);
        return s;
    }